

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O3

uint64_t pull_le64(uchar **cursor,size_t *max)

{
  ulong __n;
  uint64_t uVar1;
  uint64_t *__src;
  uint64_t *puVar2;
  size_t sVar3;
  uint64_t local_30;
  
  __n = *max;
  __src = (uint64_t *)*cursor;
  if (__n < 8) {
    memcpy(&local_30,__src,__n);
    puVar2 = (uint64_t *)0x0;
    memset((void *)((long)&local_30 + __n),0,8 - __n);
    sVar3 = 0;
    __src = &local_30;
  }
  else {
    puVar2 = __src + 1;
    sVar3 = __n - 8;
  }
  uVar1 = *__src;
  *cursor = (uchar *)puVar2;
  *max = sVar3;
  return uVar1;
}

Assistant:

uint64_t pull_le64(const unsigned char **cursor, size_t *max)
{
    leint64_t lev;
    pull_bytes(&lev, sizeof(lev), cursor, max);
    return le64_to_cpu(lev);
}